

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal.cpp
# Opt level: O1

void am_generic_renew_copied_comp(Am_Object *object)

{
  ulong uVar1;
  ulong *puVar2;
  bool bVar3;
  unsigned_short uVar4;
  Am_Slot_Key AVar5;
  Am_Value *pAVar6;
  Am_Wrapper *pAVar7;
  long lVar8;
  Am_Object *pAVar9;
  Am_Object current_component;
  Am_Object part;
  Am_Part_Iterator parts;
  Am_Value_List components;
  Am_Value_List new_components;
  Am_Part_Iterator local_a8;
  Am_Value_List local_98;
  Am_Object local_88;
  Am_Part_Iterator local_80;
  Am_Value_List local_70;
  ulong *local_60;
  Am_Value_List local_58;
  Am_Object *local_48;
  ulong *local_40;
  Am_Object *local_38;
  
  Am_Value_List::Am_Value_List(&local_70);
  pAVar6 = Am_Object::Get(object,0x82,0);
  Am_Value_List::operator=(&local_70,pAVar6);
  Am_Value_List::Am_Value_List(&local_58);
  Am_Object::Am_Object(&local_88,object);
  Am_Part_Iterator::Am_Part_Iterator(&local_80,&local_88);
  Am_Object::~Am_Object(&local_88);
  uVar4 = Am_Part_Iterator::Length(&local_80);
  bVar3 = Am_Value_List::Empty(&local_70);
  if (uVar4 == 0 || bVar3) {
    Am_Value_List::Am_Value_List(&local_98);
    pAVar7 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_98);
    Am_Object::Set(object,0x82,pAVar7,0);
    Am_Value_List::~Am_Value_List(&local_98);
  }
  else {
    local_48 = object;
    local_60 = (ulong *)operator_new__((ulong)uVar4 * 0x10 + 8);
    *local_60 = (ulong)((uint)uVar4 * 2);
    pAVar9 = (Am_Object *)(local_60 + 1);
    memset(pAVar9,0,(ulong)uVar4 * 0x10);
    local_98.data = (Am_Value_List_Data *)0x0;
    Am_Part_Iterator::Start(&local_80);
    uVar1 = (ulong)uVar4;
    local_38 = pAVar9;
    while (bVar3 = Am_Part_Iterator::Last(&local_80), !bVar3) {
      Am_Part_Iterator::Get(&local_a8);
      Am_Object::operator=((Am_Object *)&local_98,&local_a8.current);
      Am_Object::~Am_Object(&local_a8.current);
      Am_Object::operator=(pAVar9 + uVar1,(Am_Object *)&local_98);
      pAVar6 = Am_Object::Get((Am_Object *)&local_98,0xc,0);
      Am_Object::operator=(pAVar9,pAVar6);
      pAVar9 = pAVar9 + 1;
      Am_Part_Iterator::Next(&local_80);
    }
    local_a8.current.data = (Am_Object_Data *)0x0;
    Am_Value_List::Start(&local_70);
    local_40 = local_60 + uVar1;
    local_a8.owner.data = (Am_Object_Data *)0x0;
    while (bVar3 = Am_Value_List::Last(&local_70), puVar2 = local_60, !bVar3) {
      pAVar6 = Am_Value_List::Get(&local_70);
      Am_Object::operator=(&local_a8.current,pAVar6);
      AVar5 = Am_Object::Get_Key(&local_a8.current);
      if (AVar5 != 2 && uVar4 != 0) {
        lVar8 = -8;
        pAVar9 = local_38;
        do {
          bVar3 = Am_Object::operator==(&local_a8.current,pAVar9);
          if (bVar3) {
            pAVar9 = (Am_Object *)((long)local_40 - lVar8);
            Am_Object::Set(pAVar9,0x85,(int)local_a8.owner.data,0);
            pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar9);
            Am_Value_List::Add(&local_58,pAVar7,Am_TAIL,true);
            local_a8.owner.data = (Am_Object_Data *)(ulong)((int)local_a8.owner.data + 1);
            break;
          }
          lVar8 = lVar8 + -8;
          pAVar9 = pAVar9 + 1;
        } while (uVar1 * 8 + 8 + lVar8 != 0);
      }
      Am_Value_List::Next(&local_70);
    }
    if (*local_60 != 0) {
      lVar8 = *local_60 << 3;
      do {
        Am_Object::~Am_Object((Am_Object *)((long)puVar2 + lVar8));
        lVar8 = lVar8 + -8;
      } while (lVar8 != 0);
    }
    operator_delete__(puVar2);
    pAVar7 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_58);
    Am_Object::Set(local_48,0x82,pAVar7,0);
    Am_Object::~Am_Object(&local_a8.current);
    Am_Object::~Am_Object((Am_Object *)&local_98);
  }
  Am_Object::~Am_Object(&local_80.owner);
  Am_Object::~Am_Object(&local_80.current);
  Am_Value_List::~Am_Value_List(&local_58);
  Am_Value_List::~Am_Value_List(&local_70);
  return;
}

Assistant:

void
am_generic_renew_copied_comp(Am_Object object)
{
  Am_Value_List components;
  components = object.Get(Am_GRAPHICAL_PARTS);
  Am_Value_List new_components;
  Am_Part_Iterator parts = object;
  int parts_length = parts.Length();
  if (components.Empty() || (parts_length == 0)) {
    object.Set(Am_GRAPHICAL_PARTS, Am_Value_List());
    return;
  }
  Am_Object *part_map = new Am_Object[parts_length * 2];
  Am_Object part;
  int i;
  for (i = 0, parts.Start(); !parts.Last(); ++i, parts.Next()) {
    part = parts.Get();
    part_map[i + parts_length] = part;
    part_map[i] = part.Get(Am_SOURCE_OF_COPY);
  }
  Am_Object current_component;
  int current_rank = 0;
  for (components.Start(); !components.Last(); components.Next()) {
    current_component = components.Get();
    if (current_component.Get_Key() == Am_NO_INHERIT)
      continue;
    for (i = 0; i < parts_length; ++i)
      if (current_component == part_map[i]) {
        part_map[i + parts_length].Set(Am_RANK, current_rank);
        new_components.Add(part_map[i + parts_length]);
        ++current_rank;
        break;
      }
  }
  delete[] part_map;
  object.Set(Am_GRAPHICAL_PARTS, new_components);
}